

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_setup_connection(connectdata *conn)

{
  char **ppcVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  void *pvVar4;
  Curl_handler *pCVar5;
  Curl_easy *data;
  
  pCVar2 = conn->data;
  conn->tls_upgraded = false;
  if (((conn->bits).httpproxy == true) && ((pCVar2->set).tunnel_thru_httpproxy == false)) {
    pCVar5 = &Curl_handler_smtps_proxy;
    if (conn->handler == &Curl_handler_smtp) {
      pCVar5 = &Curl_handler_smtp_proxy;
    }
    conn->handler = pCVar5;
    CVar3 = Curl_http_setup_conn(conn);
    return CVar3;
  }
  pvVar4 = (*Curl_ccalloc)(0x28,1);
  (pCVar2->req).protop = pvVar4;
  if (pvVar4 == (void *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    ppcVar1 = &(pCVar2->state).path;
    *ppcVar1 = *ppcVar1 + 1;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Set up the proxy if necessary */
  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel SMTP operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_smtp)
      conn->handler = &Curl_handler_smtp_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_smtps_proxy;
#else
      failf(data, "SMTPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }
    /* set it up as a HTTP connection instead */
    return conn->handler->setup_connection(conn);

#else
    failf(data, "SMTP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}